

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

bool __thiscall c4::base64_valid(c4 *this,csubstr encoded)

{
  c4 cVar1;
  bool bVar2;
  char *pcVar3;
  
  if (((undefined1  [16])encoded & (undefined1  [16])0x3) == (undefined1  [16])0x0) {
    bVar2 = true;
    if (encoded.str != (char *)0x0) {
      pcVar3 = (char *)0x0;
      do {
        cVar1 = this[(long)pcVar3];
        if (((long)(char)cVar1 < 0) ||
           ((cVar1 != (c4)0x3d && ((&detail::base64_char_to_sextet_)[(char)cVar1] == -1))))
        goto LAB_001ff442;
        pcVar3 = pcVar3 + 1;
      } while (encoded.str != pcVar3);
    }
  }
  else {
LAB_001ff442:
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool base64_valid(csubstr encoded)
{
    if(encoded.len % 4) return false;
    for(const char c : encoded)
    {
        if(c < 0/* || c >= 128*/)
            return false;
        if(c == '=')
            continue;
        if(detail::base64_char_to_sextet_[c] == char(-1))
            return false;
    }
    return true;
}